

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

int Kit_GraphLevelNum_rec(Kit_Graph_t *pGraph,Kit_Node_t *pNode)

{
  int iVar1;
  Kit_Node_t *pKVar2;
  int local_3c;
  int Depth1;
  int Depth0;
  Kit_Node_t *pNode_local;
  Kit_Graph_t *pGraph_local;
  
  iVar1 = Kit_GraphNodeIsVar(pGraph,pNode);
  if (iVar1 == 0) {
    pKVar2 = Kit_GraphNodeFanin0(pGraph,pNode);
    iVar1 = Kit_GraphLevelNum_rec(pGraph,pKVar2);
    pKVar2 = Kit_GraphNodeFanin1(pGraph,pNode);
    local_3c = Kit_GraphLevelNum_rec(pGraph,pKVar2);
    if (local_3c < iVar1) {
      local_3c = iVar1;
    }
    pGraph_local._4_4_ = local_3c + 1;
  }
  else {
    pGraph_local._4_4_ = 0;
  }
  return pGraph_local._4_4_;
}

Assistant:

int Kit_GraphLevelNum_rec( Kit_Graph_t * pGraph, Kit_Node_t * pNode )
{
    int Depth0, Depth1;
    if ( Kit_GraphNodeIsVar(pGraph, pNode) )
        return 0;
    Depth0 = Kit_GraphLevelNum_rec( pGraph, Kit_GraphNodeFanin0(pGraph, pNode) );
    Depth1 = Kit_GraphLevelNum_rec( pGraph, Kit_GraphNodeFanin1(pGraph, pNode) );
    return 1 + KIT_MAX( Depth0, Depth1 );
}